

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::ProcessLoad(AggressiveDCEPass *this,Function *func,uint32_t varId)

{
  bool bVar1;
  value_type *__x;
  _Node_iterator_base<unsigned_int,_false> local_30;
  _Node_iterator_base<unsigned_int,_false> local_28;
  undefined1 local_1c [8];
  uint32_t varId_local;
  Function *func_local;
  AggressiveDCEPass *this_local;
  
  local_1c._0_4_ = varId;
  unique0x100000b3 = func;
  func_local = (Function *)this;
  bVar1 = IsLocalVar(this,varId,func);
  if (bVar1) {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(&this->live_local_vars_,(key_type *)local_1c);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end(&this->live_local_vars_);
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) {
      AddStores(this,stack0xffffffffffffffe8,local_1c._0_4_);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
               &this->live_local_vars_,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_1c,__x);
    }
  }
  return;
}

Assistant:

void AggressiveDCEPass::ProcessLoad(Function* func, uint32_t varId) {
  // Only process locals
  if (!IsLocalVar(varId, func)) return;
  // Return if already processed
  if (live_local_vars_.find(varId) != live_local_vars_.end()) return;
  // Mark all stores to varId as live
  AddStores(func, varId);
  // Cache varId as processed
  live_local_vars_.insert(varId);
}